

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O1

void processEvents(SWindowData *window_data)

{
  void *pvVar1;
  int iVar2;
  XEvent event;
  XEvent XStack_d8;
  
  if (window_data->close != false) {
    return;
  }
  pvVar1 = window_data->specific;
  do {
    iVar2 = XPending(*(undefined8 *)((long)pvVar1 + 8));
    if (iVar2 == 0) {
      return;
    }
    XNextEvent(*(undefined8 *)((long)pvVar1 + 8),&XStack_d8);
    processEvent(window_data,&XStack_d8);
  } while (window_data->close == false);
  return;
}

Assistant:

static void
processEvents(SWindowData *window_data) {
    XEvent          event;
    SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) window_data->specific;

    while ((window_data->close == false) && XPending(window_data_x11->display)) {
        XNextEvent(window_data_x11->display, &event);
        processEvent(window_data, &event);
    }
}